

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

unique_ptr<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>_> __thiscall
spdlog::details::
make_unique<spdlog::pattern_formatter,std::__cxx11::string_const&,spdlog::pattern_time_type_const&,std::__cxx11::string_const&,std::unordered_map<char,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>,std::hash<char>,std::equal_to<char>,std::allocator<std::pair<char_const,std::unique_ptr<spdlog::custom_flag_formatter,std::default_delete<spdlog::custom_flag_formatter>>>>>>
          (details *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          pattern_time_type *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,
          unordered_map<char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>,_std::hash<char>,_std::equal_to<char>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>_>
          *args_3)

{
  pattern_time_type pVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Head_base<0UL,_spdlog::pattern_formatter_*,_false> _Var4;
  pattern_formatter *this_00;
  pointer local_b0;
  size_type local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  pointer local_90;
  size_type local_88;
  char local_80;
  undefined7 uStack_7f;
  undefined8 uStack_78;
  _Head_base<0UL,_spdlog::pattern_formatter_*,_false> local_70;
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  this_00 = (pattern_formatter *)operator_new(0xe0);
  local_b0 = &local_a0;
  pcVar2 = (args->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar2,pcVar2 + args->_M_string_length);
  pVar1 = *args_1;
  pcVar2 = (args_2->_M_dataplus)._M_p;
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar2,pcVar2 + args_2->_M_string_length);
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_68,args_3,args_3);
  (this_00->super_formatter)._vptr_formatter = (_func_int **)&PTR__pattern_formatter_001b1068;
  paVar3 = &(this_00->pattern_).field_2;
  (this_00->pattern_)._M_dataplus._M_p = (pointer)paVar3;
  if (local_b0 == &local_a0) {
    paVar3->_M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
    *(undefined8 *)((long)&(this_00->pattern_).field_2 + 8) = uStack_98;
  }
  else {
    (this_00->pattern_)._M_dataplus._M_p = local_b0;
    paVar3->_M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
  }
  (this_00->pattern_)._M_string_length = local_a8;
  local_a8 = 0;
  local_a0 = '\0';
  paVar3 = &(this_00->eol_).field_2;
  (this_00->eol_)._M_dataplus._M_p = (pointer)paVar3;
  if (local_90 == &local_80) {
    paVar3->_M_allocated_capacity = CONCAT71(uStack_7f,local_80);
    *(undefined8 *)((long)&(this_00->eol_).field_2 + 8) = uStack_78;
  }
  else {
    (this_00->eol_)._M_dataplus._M_p = local_90;
    (this_00->eol_).field_2._M_allocated_capacity = CONCAT71(uStack_7f,local_80);
  }
  (this_00->eol_)._M_string_length = local_88;
  local_88 = 0;
  local_80 = '\0';
  this_00->pattern_time_type_ = pVar1;
  this_00->need_localtime_ = false;
  (this_00->last_log_secs_).__r = 0;
  (this_00->formatters_).
  super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this_00->formatters_).
  super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this_00->formatters_).
  super__Vector_base<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0 = &local_a0;
  local_90 = &local_80;
  local_70._M_head_impl = (pattern_formatter *)this;
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&(this_00->custom_handlers_)._M_h,&local_68);
  (this_00->cached_tm_).tm_zone = (char *)0x0;
  *(undefined8 *)&(this_00->cached_tm_).tm_isdst = 0;
  (this_00->cached_tm_).tm_gmtoff = 0;
  (this_00->cached_tm_).tm_mon = 0;
  (this_00->cached_tm_).tm_year = 0;
  (this_00->cached_tm_).tm_wday = 0;
  (this_00->cached_tm_).tm_yday = 0;
  (this_00->cached_tm_).tm_sec = 0;
  (this_00->cached_tm_).tm_min = 0;
  (this_00->cached_tm_).tm_hour = 0;
  (this_00->cached_tm_).tm_mday = 0;
  pattern_formatter::compile_pattern_(this_00,&this_00->pattern_);
  _Var4._M_head_impl = local_70._M_head_impl;
  ((local_70._M_head_impl)->super_formatter)._vptr_formatter = (_func_int **)this_00;
  std::
  _Hashtable<char,_std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>,_std::allocator<std::pair<const_char,_std::unique_ptr<spdlog::custom_flag_formatter,_std::default_delete<spdlog::custom_flag_formatter>_>_>_>,_std::__detail::_Select1st,_std::equal_to<char>,_std::hash<char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return (__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
          )(__uniq_ptr_data<spdlog::pattern_formatter,_std::default_delete<spdlog::pattern_formatter>,_true,_true>
            )_Var4._M_head_impl;
}

Assistant:

std::unique_ptr<T> make_unique(Args &&...args) {
    static_assert(!std::is_array<T>::value, "arrays not supported");
    return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}